

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckAspectRatio.cpp
# Opt level: O1

int CheckAspectRatio(double smallest_ratio,int x,int y,int z,char *what,bool DoIo)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  double dVar5;
  
  iVar1 = x;
  if (y < x) {
    iVar1 = y;
  }
  if (z <= iVar1) {
    iVar1 = z;
  }
  iVar2 = y;
  if (y < x) {
    iVar2 = x;
  }
  if (iVar2 <= z) {
    iVar2 = z;
  }
  dVar5 = (double)iVar1 / (double)iVar2;
  iVar1 = 0x7f;
  if (smallest_ratio <= dVar5) {
    iVar1 = 0;
  }
  if (dVar5 < smallest_ratio && DoIo) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HPCG_fout,"The ",4);
    if (what == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(HPCG_fout + -0x18) + 0x11d288);
    }
    else {
      sVar3 = strlen(what);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HPCG_fout,what,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&HPCG_fout," sizes (",8);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&HPCG_fout,x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,z);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,") are invalid because the ratio min(x,y,z)/max(x,y,z)=",0x36);
    poVar4 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is too small (at least ",0x18);
    poVar4 = std::ostream::_M_insert<double>(smallest_ratio);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is required).",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&HPCG_fout,
               "The shape should resemble a 3D cube. Please adjust and try again.",0x41);
    std::ios::widen((char)*(undefined8 *)(HPCG_fout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    std::ostream::flush();
    iVar1 = 0x7f;
  }
  return iVar1;
}

Assistant:

int
CheckAspectRatio(double smallest_ratio, int x, int y, int z, const char *what, bool DoIo) {
  double current_ratio = std::min(std::min(x, y), z) / double(std::max(std::max(x, y), z));

  if (current_ratio < smallest_ratio) { // ratio of the smallest to the largest
    if (DoIo) {
      HPCG_fout << "The " << what << " sizes (" << x << "," << y << "," << z <<
        ") are invalid because the ratio min(x,y,z)/max(x,y,z)=" << current_ratio <<
        " is too small (at least " << smallest_ratio << " is required)." << std::endl;
      HPCG_fout << "The shape should resemble a 3D cube. Please adjust and try again." << std::endl;
      HPCG_fout.flush();
    }

#ifndef HPCG_NO_MPI
    MPI_Abort(MPI_COMM_WORLD, 127);
#endif

    return 127;
  }

  return 0;
}